

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  
  lVar4 = 0x730;
  if ((byte)(instate - 0xd) < 3) {
    lVar4 = *(long *)(&DAT_0016efc8 + (ulong)(byte)(instate - 0xd) * 8);
  }
  pcVar1 = data->conn;
  puVar5 = *(undefined8 **)((long)&data->magic + lVar4);
  iVar6 = 0;
  if (!init) {
    iVar6 = (pcVar1->proto).ftpc.count1 + 1;
  }
  pFVar2 = (data->req).p.file;
  pp = &pcVar1->proto;
  (pcVar1->proto).ftpc.count1 = iVar6;
  if (puVar5 != (undefined8 *)0x0) {
    iVar8 = 0;
    for (; (iVar8 < iVar6 && (puVar5 != (undefined8 *)0x0)); puVar5 = (undefined8 *)puVar5[1]) {
      iVar8 = iVar8 + 1;
    }
    if (puVar5 != (undefined8 *)0x0) {
      pcVar7 = (char *)*puVar5;
      bVar9 = *pcVar7 == '*';
      *(uint *)((long)&pcVar1->proto + 0x104) = (uint)bVar9;
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",pcVar7 + bVar9);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      goto LAB_001294ec;
    }
  }
  if (instate == '\r') {
    if (pFVar2->fd == 0) {
      lVar4 = (pcVar1->proto).ftpc.known_filesize;
      if (lVar4 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar4);
        CVar3 = ftp_state_retr(data,(pcVar1->proto).ftpc.known_filesize);
        return CVar3;
      }
      if ((((data->set).field_0x8ce & 2) == 0) && (((data->state).field_0x775 & 0x10) == 0)) {
        CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(pcVar1->proto).ftpc.file);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        instate = '\x18';
      }
      else {
        CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar1->proto).ftpc.file);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        instate = ' ';
      }
    }
    else {
      instate = '\0';
    }
  }
  else {
    if (instate == '\x0e') {
      CVar3 = ftp_state_ul_setup(data,false);
      return CVar3;
    }
    if (instate == '\x0f') {
      return CURLE_OK;
    }
    if ((*(byte *)((long)&pcVar1->proto + 0x112) & 8) != 0) {
LAB_001294fe:
      CVar3 = ftp_state_mdtm(data);
      return CVar3;
    }
    (pcVar1->proto).ftpc.count2 = 0;
    if (((((ulong)pcVar1->bits & 0x40) == 0) ||
        (pcVar7 = (pcVar1->proto).ftpc.entrypath, pcVar7 == (char *)0x0)) ||
       (((pcVar1->proto).ftpc.dirdepth != 0 && (**(pcVar1->proto).ftpc.dirs == '/')))) {
      if ((pcVar1->proto).ftpc.dirdepth == 0) goto LAB_001294fe;
      (pcVar1->proto).ftpc.cwdcount = 1;
      pcVar7 = *(pcVar1->proto).ftpc.dirs;
    }
    else {
      (pcVar1->proto).ftpc.cwdcount = 0;
    }
    CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"CWD %s",pcVar7);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    instate = '\x10';
  }
LAB_001294ec:
  _ftp_state(data,instate);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i < ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      ftp_state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        ftp_state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files. It
               prevents the state machine from requesting the file size from
               the server. With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size. Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers do not report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}